

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestReserve(void)

{
  bool bVar1;
  OutputBuffer ob_1;
  size_t reserveSize;
  OutputBuffer ob;
  lazy_ostream *in_stack_fffffffffffff748;
  char *pcVar2;
  basic_cstring<const_char> *in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  begin *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  OutputBuffer *in_stack_fffffffffffff770;
  lazy_ostream *in_stack_fffffffffffff788;
  size_t in_stack_fffffffffffff790;
  size_t line_num;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  unit_test_log_t *in_stack_fffffffffffff7a0;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  unit_test_log_t *in_stack_fffffffffffff7c0;
  undefined1 local_6b8 [24];
  undefined1 local_6a0 [56];
  basic_cstring<const_char> local_668;
  undefined1 local_658 [24];
  undefined1 local_640 [56];
  basic_cstring<const_char> local_608;
  basic_cstring<const_char> local_5f8;
  basic_cstring<const_char> local_5e8;
  undefined1 local_5d8 [56];
  basic_cstring<const_char> local_5a0;
  undefined1 local_58c [28];
  undefined1 local_570 [56];
  basic_cstring<const_char> local_538;
  undefined1 local_528 [24];
  undefined1 local_510 [56];
  basic_cstring<const_char> local_4d8;
  undefined1 local_4c8 [24];
  undefined1 local_4b0 [56];
  basic_cstring<const_char> local_478;
  size_type local_468;
  basic_cstring<const_char> local_460;
  undefined1 local_450 [56];
  basic_cstring<const_char> local_418;
  undefined1 local_404 [28];
  undefined1 local_3e8 [56];
  basic_cstring<const_char> local_3b0;
  undefined1 local_3a0 [24];
  undefined1 local_388 [56];
  basic_cstring<const_char> local_350;
  undefined1 local_340 [24];
  undefined1 local_328 [56];
  basic_cstring<const_char> local_2f0;
  size_type local_2e0;
  basic_cstring<const_char> local_2d8;
  undefined1 local_2c8 [56];
  basic_cstring<const_char> local_290;
  undefined1 local_27c [28];
  undefined1 local_260 [56];
  basic_cstring<const_char> local_228 [2];
  undefined1 local_208 [12];
  int local_1fc;
  basic_cstring<const_char> local_1f8;
  undefined1 local_1e8 [56];
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [24];
  undefined1 local_188 [56];
  basic_cstring<const_char> local_150;
  undefined1 local_13c [28];
  undefined1 local_120 [56];
  basic_cstring<const_char> local_e8;
  undefined1 local_d4 [28];
  undefined1 local_b8 [56];
  basic_cstring<const_char> local_80 [5];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffff760,(const_string *)in_stack_fffffffffffff758,
             (size_t)in_stack_fffffffffffff750);
  boost::unit_test::unit_test_log_t::operator<<
            (in_stack_fffffffffffff7c0,
             (begin *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffff758,
             (log_level)((ulong)in_stack_fffffffffffff750 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [12])in_stack_fffffffffffff750);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> *)
             0x225c04);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffff750);
  avro::OutputBuffer::OutputBuffer
            (in_stack_fffffffffffff770,CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_d4 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_d4._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x225cd4);
    local_d4._0_4_ = 0;
    in_stack_fffffffffffff758 = "0U";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_d4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_b8,local_d4 + 0xc,0x46,1,2,local_d4 + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x225d59);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_13c + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_13c._4_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x225e2c);
    local_13c._0_4_ = 0;
    in_stack_fffffffffffff758 = "0U";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_13c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_120,local_13c + 0xc,0x47,1,2,local_13c + 4,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x225eb1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1a0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1a0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x225f84);
    local_1a0._0_4_ = 0;
    in_stack_fffffffffffff758 = "0";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_1a0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_188,local_1a0 + 8,0x48,1,2,local_1a0 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x226006);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1fc = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x2260d9);
    local_208._8_4_ = 0;
    in_stack_fffffffffffff758 = "0";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)(local_208 + 8);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1e8,&local_1f8,0x49,1,2,&local_1fc,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22615b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x226187);
  local_208._0_8_ = (iterator)0x800;
  avro::OutputBuffer::OutputBuffer
            (in_stack_fffffffffffff770,CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_27c + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_27c._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x22625a);
    local_27c._0_4_ = 0;
    in_stack_fffffffffffff758 = "0U";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_27c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_260,local_27c + 0xc,0x50,1,2,local_27c + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2262df);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_2e0 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x2263b2);
    in_stack_fffffffffffff758 = "kMinBlockSize";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)&avro::detail::kMinBlockSize;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2c8,&local_2d8,0x51,1,2,&local_2e0,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22642b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_340 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_340._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x2264fe);
    local_340._0_4_ = 1;
    in_stack_fffffffffffff758 = "1";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_340;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_328,local_340 + 8,0x52,1,2,local_340 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x226580);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3a0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_3a0._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x226653);
    local_3a0._0_4_ = 0;
    in_stack_fffffffffffff758 = "0";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_3a0;
    pcVar2 = "ob.numDataChunks()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_388,local_3a0 + 8,0x53,1,2,local_3a0 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2266d5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_208._0_8_ = local_208._0_8_ + 0x2000;
  avro::OutputBuffer::reserve((OutputBuffer *)in_stack_fffffffffffff750,(size_type)pcVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_404 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_404._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x2267d5);
    local_404._0_4_ = 0;
    in_stack_fffffffffffff758 = "0U";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_404;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3e8,local_404 + 0xc,0x59,1,2,local_404 + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22685a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_468 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x22692d);
    in_stack_fffffffffffff758 = "reserveSize";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_208;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_450,&local_460,0x5a,1,2,&local_468,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2269a7);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4c8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_4c8._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x226a7a);
    local_4c8._0_4_ = 2;
    in_stack_fffffffffffff758 = "2";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_4c8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_4b0,local_4c8 + 8,0x5b,1,2,local_4c8 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x226afc);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_528 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_528._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x226bcf);
    local_528._0_4_ = 0;
    in_stack_fffffffffffff758 = "0";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_528;
    pcVar2 = "ob.numDataChunks()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_510,local_528 + 8,0x5c,1,2,local_528 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x226c51);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_208._0_8_ = local_208._0_8_ + 0x4800;
  avro::OutputBuffer::reserve((OutputBuffer *)in_stack_fffffffffffff750,(size_type)pcVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_538,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_58c + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_58c._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x226d51);
    local_58c._0_4_ = 0;
    in_stack_fffffffffffff758 = "0U";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_58c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_570,local_58c + 0xc,99,1,2,local_58c + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x226dd0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               in_stack_fffffffffffff790,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_fffffffffffff7a0 =
         (unit_test_log_t *)avro::OutputBuffer::freeSpace((OutputBuffer *)0x226e91);
    local_5f8.m_begin = (iterator)(local_208._0_8_ + 0x800);
    in_stack_fffffffffffff758 = "reserveSize + kMinBlockSize/2";
    in_stack_fffffffffffff750 = &local_5f8;
    local_5f8.m_end = (iterator)in_stack_fffffffffffff7a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_5d8,&local_5e8,100,1,2,&local_5f8.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x226f1b);
    in_stack_fffffffffffff79f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff79f);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_608,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               line_num,(const_string *)in_stack_fffffffffffff788);
    in_stack_fffffffffffff788 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_658 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_658._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x226fdc);
    local_658._0_4_ = 4;
    in_stack_fffffffffffff758 = "4";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_658;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_640,local_658 + 8,0x65,1,2,local_658 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227058);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_668,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff750);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
               line_num,(const_string *)in_stack_fffffffffffff788);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff758,(char (*) [1])in_stack_fffffffffffff750);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_6b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_6b8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x227119);
    local_6b8._0_4_ = 0;
    in_stack_fffffffffffff758 = "0";
    in_stack_fffffffffffff750 = (basic_cstring<const_char> *)local_6b8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_6a0,local_6b8 + 8,0x66,1,2,local_6b8 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x227195);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x2271bb);
  return;
}

Assistant:

void TestReserve()
{
    BOOST_TEST_MESSAGE( "TestReserve");
    {
        OutputBuffer ob;
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(ob.numChunks(), 0);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }

    {
        size_t reserveSize = kMinBlockSize/2;

        OutputBuffer ob (reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kMinBlockSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);

        // reserve should add a single block
        reserveSize += 8192;

        ob.reserve(reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);

        // reserve should add two blocks, one of the maximum size and
        // one of the minimum size
        reserveSize += (kMaxBlockSize + kMinBlockSize/2);

        ob.reserve(reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize + kMinBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 4);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }
}